

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

char * archive_read_disk_uname(archive *_a,int64_t uid)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_uname");
  if ((iVar1 == 0) && (*(code **)&_a[1].current_codepage != (code *)0x0)) {
    pcVar2 = (char *)(**(code **)&_a[1].current_codepage)(_a[1].read_data_block,uid);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *
archive_read_disk_uname(struct archive *_a, int64_t uid)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_disk_uname"))
		return (NULL);
	if (a->lookup_uname == NULL)
		return (NULL);
	return ((*a->lookup_uname)(a->lookup_uname_data, uid));
}